

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_dict.c
# Opt level: O2

void BrotliInitEncoderDictionary(BrotliEncoderDictionary *dict)

{
  BrotliDictionary *pBVar1;
  long lVar2;
  
  pBVar1 = (BrotliDictionary *)BrotliGetDictionary();
  dict->words = pBVar1;
  lVar2 = BrotliGetTransforms();
  dict->num_transforms = *(uint32_t *)(lVar2 + 0x18);
  dict->hash_table_words = kStaticDictionaryHashWords;
  dict->hash_table_lengths = "\b";
  dict->buckets = kStaticDictionaryBuckets;
  dict->dict_words = kStaticDictionaryWords;
  dict->cutoffTransformsCount = 10;
  dict->cutoffTransforms = 0x71b520ada2d3200;
  return;
}

Assistant:

void BrotliInitEncoderDictionary(BrotliEncoderDictionary* dict) {
  dict->words = BrotliGetDictionary();
  dict->num_transforms = (uint32_t)BrotliGetTransforms()->num_transforms;

  dict->hash_table_words = kStaticDictionaryHashWords;
  dict->hash_table_lengths = kStaticDictionaryHashLengths;
  dict->buckets = kStaticDictionaryBuckets;
  dict->dict_words = kStaticDictionaryWords;

  dict->cutoffTransformsCount = kCutoffTransformsCount;
  dict->cutoffTransforms = kCutoffTransforms;
}